

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O3

string * __thiscall
TextReader::read_quoted_abi_cxx11_(string *__return_storage_ptr__,TextReader *this)

{
  string *result;
  string local_40;
  
  load_next_token(this);
  if (this->current_token_type_ == ttQuoted) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->current_line_);
    this->current_token_pos_ = this->current_token_pos_ + this->current_token_len_;
    this->current_token_len_ = 0;
    this->current_token_type_ = ttUnknown;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Expect a quoted value","");
    parse_error(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string read_quoted() {
        load_next_token();
        if (current_token_type_ == ttQuoted) {
            std::string result = current_line_.substr(current_token_pos_ + 1, current_token_len_ - 2);
            skip_token();
            return result;
        } else {
            parse_error("Expect a quoted value");
            return std::string();
        };
    }